

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_bagwell.h
# Opt level: O2

void __thiscall
vector_bagwell<unsigned_long,_16U>::~vector_bagwell(vector_bagwell<unsigned_long,_16U> *this)

{
  pointer ppuVar1;
  uint uVar2;
  
  uVar2 = 0;
  while( true ) {
    ppuVar1 = (this->_index_block).
              super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_index_block).
                      super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppuVar1 >> 3) <= (ulong)uVar2)
    break;
    free(ppuVar1[uVar2]);
    uVar2 = uVar2 + 1;
  }
  std::_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>::~_Vector_base
            ((_Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_> *)this);
  return;
}

Assistant:

~vector_bagwell()
	{
		for (unsigned i=0; i < _index_block.size(); ++i)
			free(_index_block[i]);
	}